

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O2

void __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::compute_clock_valuation_from_dbm(clockval_dbm_t *this)

{
  rational<long> *prVar1;
  long lVar2;
  clock_id_t id;
  ulong uVar3;
  vector<int,_std::allocator<int>_> clock_values;
  allocator_type local_51;
  rational<long> local_50;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  local_50.num._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,(ulong)this->_dim,
             (value_type_conflict4 *)&local_50,&local_51);
  tchecker::dbm::satisfying_integer_valuation
            (this->_dbm,this->_dim,(vector<int,_std::allocator<int>_> *)&local_40);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < this->_dim; uVar3 = uVar3 + 1) {
    boost::rational<long>::rational<int,int>
              (&local_50,(int *)((long)local_40._M_impl.super__Vector_impl_data._M_start + lVar2),
               &this->_denominator,(type *)0x0);
    prVar1 = make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::operator[]
                       (&this->_clockval->super_clock_value_array_t,(capacity_t_conflict)uVar3);
    prVar1->num = CONCAT44(local_50.num._4_4_,(undefined4)local_50.num);
    prVar1->den = local_50.den;
    lVar2 = lVar2 + 4;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void compute_clock_valuation_from_dbm()
  {
    std::vector<tchecker::integer_t> clock_values(_dim, 0);
    tchecker::dbm::satisfying_integer_valuation(_dbm, _dim, clock_values);
    for (tchecker::clock_id_t id = 0; id < _dim; ++id)
      (*_clockval)[id] = tchecker::clock_rational_value_t{clock_values[id], _denominator};
  }